

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_CreateTapScriptControl_Test::TestBody(TaprootUtil_CreateTapScriptControl_Test *this)

{
  allocator<cfd::core::ByteData256> *this_00;
  pointer *this_01;
  initializer_list<cfd::core::ByteData256> __l;
  bool bVar1;
  char *pcVar2;
  ScriptBuilder *pSVar3;
  reference pvVar4;
  reference this_02;
  char *in_R9;
  TapScriptData *script_data_00;
  ByteData256 *local_e48;
  string local_df0;
  AssertHelper local_dd0;
  Message local_dc8;
  bool local_db9;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar__1;
  Message local_da0;
  string local_d98;
  undefined1 local_d78 [8];
  AssertionResult gtest_ar_8;
  ByteData local_d48;
  ScriptWitness local_d30;
  ByteData local_d10;
  ScriptWitness local_cf8;
  undefined1 local_cd8 [8];
  SchnorrSignature schnorr_sig;
  Message local_ca8;
  string local_ca0;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar_7;
  SchnorrSignature sig2;
  Message local_c40;
  string local_c38;
  undefined1 local_c18 [8];
  AssertionResult gtest_ar_6;
  SigHashType local_bec;
  undefined1 local_be0 [8];
  ByteData256 sighash2;
  undefined1 local_bb0 [8];
  TapScriptData script_data;
  allocator<cfd::core::TxOut> local_b39;
  undefined1 local_b38 [8];
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxo_list;
  Amount local_ae8;
  allocator local_ad1;
  string local_ad0;
  undefined1 local_ab0 [8];
  Address addr2;
  undefined1 local_918 [8];
  Transaction tx2;
  Message local_8d0;
  string local_8c8;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_5;
  ScriptWitness local_880;
  ScriptWitness local_860;
  undefined1 local_840 [8];
  ByteData der_sig;
  ByteData sig;
  SigHashType local_7fc;
  ByteData local_7f0;
  undefined1 local_7d8 [8];
  ByteData256 sighash;
  SigHashType sighash_type;
  Script pkh_script1;
  string local_770;
  undefined1 local_750 [8];
  Pubkey pk1;
  string local_730;
  undefined1 local_710 [8];
  Privkey key1;
  Message local_6e8;
  string local_6e0;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_4;
  Amount amt1;
  string local_698;
  Txid local_678;
  undefined1 local_658 [8];
  Transaction tx1;
  Message local_610;
  Script local_608;
  string local_5d0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_3;
  Message local_598;
  Script local_590;
  string local_558;
  string local_538;
  undefined1 local_518 [8];
  AssertionResult gtest_ar_2;
  Message local_500;
  string local_4f8;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_1;
  Address addr01;
  ByteData taproot_control;
  SchnorrPubkey pk0;
  Script locking_script;
  undefined1 local_2d0 [8];
  TaprootScriptTree tree;
  string local_238;
  allocator local_211;
  string local_210;
  ByteData256 *local_1f0;
  ByteData256 local_1e8;
  ByteData256 local_1d0;
  undefined1 local_1b8 [24];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ScriptBuilder local_178;
  undefined1 local_158 [8];
  Script redeem_script;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootUtil_CreateTapScriptControl_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             &local_51);
  cfd::core::Privkey::Privkey((Privkey *)local_30,&local_50,kMainnet,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x6d96a4,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_178);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_)
  ;
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_178,
                      (ByteData *)
                      &nodes.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_158,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_178);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1f0 = &local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_210,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,&local_211);
  cfd::core::ByteData256::ByteData256(&local_1e8,&local_210);
  local_1f0 = &local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_238,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
             ,(allocator *)
              ((long)&tree.nodes_.
                      super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256(&local_1d0,&local_238);
  tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_1b8._0_8_ = &local_1e8;
  local_1b8._8_8_ = (pointer)0x2;
  this_00 = (allocator<cfd::core::ByteData256> *)
            ((long)&tree.nodes_.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<cfd::core::ByteData256>::allocator(this_00);
  __l._M_len = local_1b8._8_8_;
  __l._M_array = (iterator)local_1b8._0_8_;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10),__l,this_00);
  std::allocator<cfd::core::ByteData256>::~allocator
            ((allocator<cfd::core::ByteData256> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_e48 = (ByteData256 *)local_1b8;
  do {
    local_e48 = local_e48 + -1;
    cfd::core::ByteData256::~ByteData256(local_e48);
  } while (local_e48 != &local_1e8);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&tree.nodes_.
                     super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)local_2d0,(Script *)local_158);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),0);
  cfd::core::TaprootScriptTree::AddBranch((TaprootScriptTree *)local_2d0,pvVar4);
  pvVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator[]
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      (local_1b8 + 0x10),1);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
  cfd::core::TapBranch::AddBranch
            ((TapBranch *)local_2d0,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (SchnorrPubkey *)&gtest_ar.message_,(TapBranch *)local_2d0,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::Address
            ((Address *)&gtest_ar_1.message_,kCfdIllegalStateError,kVersion1,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_4f8,(Address *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_4d8,
             "\"bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666\"",
             "addr01.GetAddress()",
             (char (*) [65])"bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666",
             &local_4f8);
  std::__cxx11::string::~string((string *)&local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_500);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_538,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::GetLockingScript(&local_590,(Address *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_558,&local_590);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_518,"locking_script.GetHex()",
             "addr01.GetLockingScript().GetHex()",&local_538,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  cfd::core::Script::~Script(&local_590);
  std::__cxx11::string::~string((string *)&local_538);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  cfd::core::Address::GetLockingScript(&local_608,(Address *)&gtest_ar_1.message_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_5d0,&local_608);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_5b0,
             "\"51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2",
             &local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  cfd::core::Script::~Script(&local_608);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_610);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx1.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  cfd::core::Transaction::Transaction((Transaction *)local_658,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_698,"cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"
             ,(allocator *)&amt1.field_0xf);
  cfd::core::Txid::Txid(&local_678,&local_698);
  cfd::core::Transaction::AddTxIn
            ((Transaction *)local_658,&local_678,0,0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid(&local_678);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator((allocator<char> *)&amt1.field_0xf);
  cfd::core::Amount::Amount((Amount *)&gtest_ar_4.message_,0x9502f518);
  cfd::core::Transaction::AddTxOut
            ((Transaction *)local_658,(Amount *)&gtest_ar_4.message_,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_6e0,(AbstractTransaction *)local_658);
  testing::internal::EqHelper<false>::Compare<char[189],std::__cxx11::string>
            ((EqHelper<false> *)local_6c0,
             "\"0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000\""
             ,"tx1.GetHex()",
             (char (*) [189])
             "0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000"
             ,&local_6e0);
  std::__cxx11::string::~string((string *)&local_6e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(&local_6e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key1.is_compressed_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key1.is_compressed_,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key1.is_compressed_);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_730,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Privkey::FromWif((Privkey *)local_710,&local_730,kCustomChain,true);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pk1.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_770,
             "023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44",
             (allocator *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Pubkey::Pubkey((Pubkey *)local_750,&local_770);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pkh_script1.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ScriptUtil::CreateP2pkhLockingScript
            ((Script *)&sighash_type.hash_algorithm_,(Pubkey *)local_750);
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Script::GetData(&local_7f0,(Script *)&sighash_type.hash_algorithm_);
  cfd::core::SigHashType::SigHashType
            (&local_7fc,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Amount::Amount
            ((Amount *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,2500000000);
  cfd::core::Transaction::GetSignatureHash
            ((ByteData256 *)local_7d8,(Transaction *)local_658,0,&local_7f0,&local_7fc,
             (Amount *)
             &sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,kVersion0);
  cfd::core::ByteData::~ByteData(&local_7f0);
  cfd::core::Privkey::CalculateEcSignature
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)local_710,
             (ByteData256 *)local_7d8,true);
  cfd::core::CryptoUtil::ConvertSignatureToDer
            ((ByteData *)local_840,
             (ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::Transaction::AddScriptWitnessStack
            (&local_860,(Transaction *)local_658,0,(ByteData *)local_840);
  cfd::core::ScriptWitness::~ScriptWitness(&local_860);
  cfd::core::Pubkey::GetData((ByteData *)&gtest_ar_5.message_,(Pubkey *)local_750);
  cfd::core::Transaction::AddScriptWitnessStack
            (&local_880,(Transaction *)local_658,0,(ByteData *)&gtest_ar_5.message_);
  cfd::core::ScriptWitness::~ScriptWitness(&local_880);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_5.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_8c8,(AbstractTransaction *)local_658);
  testing::internal::EqHelper<false>::Compare<char[407],std::__cxx11::string>
            ((EqHelper<false> *)local_8a8,
             "\"02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\""
             ,"tx1.GetHex()",
             (char (*) [407])
             "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000"
             ,&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a8);
  if (!bVar1) {
    testing::Message::Message(&local_8d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_8a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_8d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a8);
  cfd::core::Transaction::Transaction((Transaction *)local_918,2,0);
  cfd::core::AbstractTransaction::GetTxid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AbstractTransaction *)local_658);
  cfd::core::Transaction::AddTxIn
            ((Transaction *)local_918,
             (Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
             0xffffffff,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid
            ((Txid *)&addr2.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_ad0,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",&local_ad1);
  cfd::core::Address::Address((Address *)local_ab0,&local_ad0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  cfd::core::Amount::Amount(&local_ae8,0x9502f130);
  cfd::core::Address::GetLockingScript
            ((Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Address *)local_ab0);
  cfd::core::Transaction::AddTxOut
            ((Transaction *)local_918,&local_ae8,
             (Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &utxo_list.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<cfd::core::TxOut>::allocator(&local_b39);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_b38,1,&local_b39);
  std::allocator<cfd::core::TxOut>::~allocator(&local_b39);
  cfd::core::TxOut::TxOut
            ((TxOut *)&script_data.code_separator_position,(Amount *)&gtest_ar_4.message_,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  this_02 = std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                      ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_b38,0);
  cfd::core::TxOut::operator=(this_02,(TxOut *)&script_data.code_separator_position);
  cfd::core::TxOut::~TxOut((TxOut *)&script_data.code_separator_position);
  cfd::core::TapScriptData::TapScriptData((TapScriptData *)local_bb0);
  cfd::core::TaprootScriptTree::GetTapLeafHash
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(TaprootScriptTree *)local_2d0);
  this_01 = &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::ByteData256::operator=((ByteData256 *)local_bb0,(ByteData256 *)this_01);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)this_01);
  cfd::core::SigHashType::SigHashType
            (&local_bec,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_6.message_);
  script_data_00 = (TapScriptData *)local_bb0;
  cfd::core::Transaction::GetSchnorrSignatureHash
            ((ByteData256 *)local_be0,(Transaction *)local_918,0,&local_bec,
             (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_b38,script_data_00
             ,(ByteData *)&gtest_ar_6.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_6.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_c38,(ByteData256 *)local_be0);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_c18,
             "\"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36\"",
             "sighash2.GetHex()",
             (char (*) [65])"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36",
             &local_c38);
  std::__cxx11::string::~string((string *)&local_c38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c18);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x6c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,&local_c40);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_c40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c18);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar_7.message_,(ByteData256 *)local_be0,(Privkey *)local_30);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_
            (&local_ca0,(SchnorrSignature *)&gtest_ar_7.message_,false);
  testing::internal::EqHelper<false>::Compare<char[129],std::__cxx11::string>
            ((EqHelper<false> *)local_c80,
             "\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9"
             ,&local_ca0);
  std::__cxx11::string::~string((string *)&local_ca0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
  if (!bVar1) {
    testing::Message::Message(&local_ca8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,&local_ca8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_ca8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
  cfd::core::SchnorrSignature::SchnorrSignature
            ((SchnorrSignature *)local_cd8,(SchnorrSignature *)&gtest_ar_7.message_);
  cfd::core::SchnorrSignature::SetSigHashType
            ((SchnorrSignature *)local_cd8,
             (SigHashType *)
             ((long)&sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  cfd::core::SchnorrSignature::GetData(&local_d10,(SchnorrSignature *)local_cd8,true);
  cfd::core::Transaction::AddScriptWitnessStack(&local_cf8,(Transaction *)local_918,0,&local_d10);
  cfd::core::ScriptWitness::~ScriptWitness(&local_cf8);
  cfd::core::ByteData::~ByteData(&local_d10);
  cfd::core::Script::GetData(&local_d48,(Script *)local_158);
  cfd::core::Transaction::AddScriptWitnessStack(&local_d30,(Transaction *)local_918,0,&local_d48);
  cfd::core::ScriptWitness::~ScriptWitness(&local_d30);
  cfd::core::ByteData::~ByteData(&local_d48);
  cfd::core::Transaction::AddScriptWitnessStack
            ((ScriptWitness *)&gtest_ar_8.message_,(Transaction *)local_918,0,
             (ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar_8.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_d98,(AbstractTransaction *)local_918);
  testing::internal::EqHelper<false>::Compare<char[569],std::__cxx11::string>
            ((EqHelper<false> *)local_d78,
             "\"020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000\""
             ,"tx2.GetHex()",
             (char (*) [569])
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000"
             ,&local_d98);
  std::__cxx11::string::~string((string *)&local_d98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d78);
  if (!bVar1) {
    testing::Message::Message(&local_da0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_da0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_da0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d78);
  local_db9 = cfd::core::SchnorrPubkey::Verify
                        ((SchnorrPubkey *)&gtest_ar.message_,(SchnorrSignature *)local_cd8,
                         (ByteData256 *)local_be0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_db8,&local_db9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
  if (!bVar1) {
    testing::Message::Message(&local_dc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_df0,(internal *)local_db8,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)script_data_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_dd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_taproot_util.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_dd0,&local_dc8);
    testing::internal::AssertHelper::~AssertHelper(&local_dd0);
    std::__cxx11::string::~string((string *)&local_df0);
    testing::Message::~Message(&local_dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_cd8);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar_7.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_be0);
  cfd::core::TapScriptData::~TapScriptData((TapScriptData *)local_bb0);
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector
            ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)local_b38);
  cfd::core::Address::~Address((Address *)local_ab0);
  cfd::core::Transaction::~Transaction((Transaction *)local_918);
  cfd::core::ByteData::~ByteData((ByteData *)local_840);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &der_sig.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_7d8);
  cfd::core::Script::~Script((Script *)&sighash_type.hash_algorithm_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_750);
  cfd::core::Privkey::~Privkey((Privkey *)local_710);
  cfd::core::Transaction::~Transaction((Transaction *)local_658);
  cfd::core::Address::~Address((Address *)&gtest_ar_1.message_);
  cfd::core::ByteData::~ByteData
            ((ByteData *)&addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)local_2d0);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             (local_1b8 + 0x10));
  cfd::core::Script::~Script((Script *)local_158);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(redeem_script);
  tree.AddBranch(nodes[0]);
  tree.AddBranch(SchnorrPubkey(nodes[1]));
  // auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  // Script locking_script = ScriptUtil::CreateTaprootLockingScript(
  //   pk.GetByteData256());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  Address addr01(NetType::kRegtest, WitnessVersion::kVersion1, pk0);
  EXPECT_EQ("bcrt1p8hh955u8526hjqhn5m5a5pmhymgecmxgerrmqj70tgvhk25mq8fq50z666", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("51203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2", addr01.GetLockingScript().GetHex());

  Transaction tx1(2, 0);
  tx1.AddTxIn(
      Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"),
      0, 0xffffffff);  // bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(amt1, locking_script);
  EXPECT_EQ("0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000", tx1.GetHex());
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");
  Pubkey pk1("023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c44");
  auto pkh_script1 = ScriptUtil::CreateP2pkhLockingScript(pk1);
  SigHashType sighash_type;
  auto sighash = tx1.GetSignatureHash(0, pkh_script1.GetData(),
        sighash_type, Amount(int64_t{2500000000}), WitnessVersion::kVersion0);
  auto sig = key1.CalculateEcSignature(sighash);
  auto der_sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
  tx1.AddScriptWitnessStack(0, der_sig);
  tx1.AddScriptWitnessStack(0, pk1.GetData());
  EXPECT_EQ("02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  Transaction tx2(2, 0);
  tx2.AddTxIn(tx1.GetTxid(), 0, 0xffffffff);  // taproot
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(Amount(int64_t{2499998000}), addr2.GetLockingScript());
  std::vector<TxOut> utxo_list(1);
  utxo_list[0] = TxOut(amt1, locking_script);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  auto sighash2 = tx2.GetSchnorrSignatureHash(0, sighash_type, utxo_list, &script_data);
  EXPECT_EQ("80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx2.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx2.AddScriptWitnessStack(0, redeem_script.GetData());
  tx2.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000", tx2.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}